

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O2

void failDecode(PDISASM pMyDisasm)

{
  builtin_strncpy((pMyDisasm->Instruction).Mnemonic,"???",4);
  (pMyDisasm->Operand1).AccessMode = 0;
  (pMyDisasm->Operand2).AccessMode = 0;
  (pMyDisasm->Operand3).AccessMode = 0;
  (pMyDisasm->Operand4).AccessMode = 0;
  (pMyDisasm->Operand5).AccessMode = 0;
  (pMyDisasm->Operand6).AccessMode = 0;
  (pMyDisasm->Operand7).AccessMode = 0;
  (pMyDisasm->Operand8).AccessMode = 0;
  (pMyDisasm->Operand9).AccessMode = 0;
  (pMyDisasm->Reserved_).ERROR_OPCODE = -1;
  return;
}

Assistant:

void __bea_callspec__ failDecode(PDISASM pMyDisasm)
{
  #ifndef BEA_LIGHT_DISASSEMBLY
   (void) strcpy (pMyDisasm->Instruction.Mnemonic, "???");
  #endif
  pMyDisasm->Operand1.AccessMode = 0;
  pMyDisasm->Operand2.AccessMode = 0;
  pMyDisasm->Operand3.AccessMode = 0;
  pMyDisasm->Operand4.AccessMode = 0;
  pMyDisasm->Operand5.AccessMode = 0;
  pMyDisasm->Operand6.AccessMode = 0;
  pMyDisasm->Operand7.AccessMode = 0;
  pMyDisasm->Operand8.AccessMode = 0;
  pMyDisasm->Operand9.AccessMode = 0;
  GV.ERROR_OPCODE = UNKNOWN_OPCODE;
}